

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Kernel::SelectedLiteral> * __thiscall
Lib::OptionBase<Kernel::SelectedLiteral>::operator=
          (OptionBase<Kernel::SelectedLiteral> *this,OptionBase<Kernel::SelectedLiteral> *other)

{
  byte *in_RSI;
  OptionBase<Kernel::SelectedLiteral> *in_RDI;
  SelectedLiteral *t;
  EVP_PKEY_CTX local_40 [48];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Kernel::SelectedLiteral> *)0x463887);
    Kernel::SelectedLiteral::~SelectedLiteral((SelectedLiteral *)0x46388f);
  }
  if ((*local_10 & 1) != 0) {
    t = (SelectedLiteral *)&in_RDI->_elem;
    unwrap((OptionBase<Kernel::SelectedLiteral> *)0x4638b0);
    move_if_value<Kernel::SelectedLiteral,_true>(t);
    MaybeUninit<Kernel::SelectedLiteral>::init((MaybeUninit<Kernel::SelectedLiteral> *)t,local_40);
    Kernel::SelectedLiteral::~SelectedLiteral((SelectedLiteral *)0x4638dc);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }